

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

CBlockIndex * __thiscall CBlockIndex::GetAncestor(CBlockIndex *this,int height)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  CBlockIndex *in_RDI;
  long in_FS_OFFSET;
  int heightSkipPrev;
  int heightSkip;
  int heightWalk;
  CBlockIndex *pindexWalk;
  undefined8 in_stack_ffffffffffffffb8;
  int local_2c;
  CBlockIndex *local_28;
  CBlockIndex *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->nHeight < in_ESI) || (in_ESI < 0)) {
    local_10 = (CBlockIndex *)0x0;
  }
  else {
    local_2c = in_RDI->nHeight;
    local_28 = in_RDI;
    while (in_ESI < local_2c) {
      iVar2 = GetSkipHeight((int)in_stack_ffffffffffffffb8);
      iVar3 = GetSkipHeight((int)in_stack_ffffffffffffffb8);
      if ((local_28->pskip == (CBlockIndex *)0x0) ||
         ((iVar2 != in_ESI && ((iVar2 <= in_ESI || ((iVar3 < iVar2 + -2 && (in_ESI <= iVar3))))))))
      {
        if (local_28->pprev == (CBlockIndex *)0x0) {
          __assert_fail("pindexWalk->pprev",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.cpp"
                        ,0x70,"const CBlockIndex *CBlockIndex::GetAncestor(int) const");
        }
        local_28 = local_28->pprev;
        local_2c = local_2c + -1;
      }
      else {
        local_28 = local_28->pskip;
        local_2c = iVar2;
      }
    }
    local_10 = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

const CBlockIndex* CBlockIndex::GetAncestor(int height) const
{
    if (height > nHeight || height < 0) {
        return nullptr;
    }

    const CBlockIndex* pindexWalk = this;
    int heightWalk = nHeight;
    while (heightWalk > height) {
        int heightSkip = GetSkipHeight(heightWalk);
        int heightSkipPrev = GetSkipHeight(heightWalk - 1);
        if (pindexWalk->pskip != nullptr &&
            (heightSkip == height ||
             (heightSkip > height && !(heightSkipPrev < heightSkip - 2 &&
                                       heightSkipPrev >= height)))) {
            // Only follow pskip if pprev->pskip isn't better than pskip->pprev.
            pindexWalk = pindexWalk->pskip;
            heightWalk = heightSkip;
        } else {
            assert(pindexWalk->pprev);
            pindexWalk = pindexWalk->pprev;
            heightWalk--;
        }
    }
    return pindexWalk;
}